

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_pack(CPUS390XState_conflict *env,uint32_t len,uint64_t dest,uint64_t src)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  target_ulong ptr;
  target_ulong ptr_00;
  uintptr_t unaff_retaddr;
  
  uVar5 = (ulong)(len >> 4);
  uVar2 = len & 0xf;
  uVar1 = cpu_ldub_data_ra_s390x(env,uVar2 + src,unaff_retaddr);
  cpu_stb_data_ra_s390x(env,uVar5 + dest,(uVar1 & 0xff) >> 4 | (uVar1 & 0xff) << 4,unaff_retaddr);
  iVar3 = uVar2 - 1;
  ptr = (src + uVar2) - 1;
  do {
    if ((int)uVar5 < 1) {
      return;
    }
    if (iVar3 < 0) {
      bVar4 = 0;
      ptr_00 = ptr;
LAB_00ae1e06:
      iVar3 = -1;
    }
    else {
      uVar1 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
      bVar4 = (byte)uVar1 & 0xf;
      ptr_00 = ptr - 1;
      if (iVar3 == 0) goto LAB_00ae1e06;
      uVar1 = cpu_ldub_data_ra_s390x(env,ptr_00,unaff_retaddr);
      bVar4 = (char)uVar1 << 4 | bVar4;
      ptr_00 = ptr - 2;
      iVar3 = iVar3 + -2;
    }
    cpu_stb_data_ra_s390x(env,(dest - 1) + uVar5,(uint)bVar4,unaff_retaddr);
    uVar5 = uVar5 - 1;
    ptr = ptr_00;
  } while( true );
}

Assistant:

void HELPER(pack)(CPUS390XState *env, uint32_t len, uint64_t dest, uint64_t src)
{
    uintptr_t ra = GETPC();
    int len_dest = len >> 4;
    int len_src = len & 0xf;
    uint8_t b;

    dest += len_dest;
    src += len_src;

    /* last byte is special, it only flips the nibbles */
    b = cpu_ldub_data_ra(env, src, ra);
    cpu_stb_data_ra(env, dest, (b << 4) | (b >> 4), ra);
    src--;
    len_src--;

    /* now pack every value */
    while (len_dest > 0) {
        b = 0;

        if (len_src >= 0) {
            b = cpu_ldub_data_ra(env, src, ra) & 0x0f;
            src--;
            len_src--;
        }
        if (len_src >= 0) {
            b |= cpu_ldub_data_ra(env, src, ra) << 4;
            src--;
            len_src--;
        }

        len_dest--;
        dest--;
        cpu_stb_data_ra(env, dest, b, ra);
    }
}